

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkSplitSop(Abc_Ntk_t *pNtk,int nCubesMax,int fVerbose)

{
  char cVar1;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  int iVar3;
  int nVars;
  int iVar4;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pFanin_00;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  int local_a4;
  char Symb;
  char *pTempSop;
  char *pSopStr2;
  char *pSopStr;
  int nSplits;
  int nCubesThis;
  int nCubes;
  int j;
  int k;
  int i;
  Abc_Obj_t *pObjNewRoot;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *vNodes;
  int fVerbose_local;
  int nCubesMax_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar3 = Abc_NtkIsStrash(pNtk);
    if ((iVar3 != 0) || (iVar3 = Abc_NtkIsNetlist(pNtk), iVar3 != 0)) {
      __assert_fail("!Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                    ,0xb06,"Abc_Ntk_t *Abc_NtkSplitSop(Abc_Ntk_t *, int, int)");
    }
    pNtk_local = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    p = Abc_NtkDfs(pNtk,0);
    for (j = 0; iVar3 = Vec_PtrSize(p), j < iVar3; j = j + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,j);
      iVar3 = Abc_ObjIsNode(pObj_00);
      if (iVar3 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                      ,0xb0d,"Abc_Ntk_t *Abc_NtkSplitSop(Abc_Ntk_t *, int, int)");
      }
      pAVar5 = Abc_NtkDupObj(pNtk_local,pObj_00,0);
      iVar3 = Abc_SopGetCubeNum((char *)(pObj_00->field_5).pData);
      if (nCubesMax < iVar3) {
        nVars = iVar3 / nCubesMax + (uint)(0 < iVar3 % nCubesMax);
        pSopStr2 = (char *)(pAVar5->field_5).pData;
        pcVar6 = Abc_SopCreateOr((Mem_Flex_t *)pNtk_local->pManFunc,nVars,(int *)0x0);
        (pAVar5->field_5).pData = pcVar6;
        iVar4 = Abc_SopIsComplement(pSopStr2);
        if (iVar4 != 0) {
          Abc_SopComplement(pSopStr2);
          Abc_SopComplement((char *)(pAVar5->field_5).pData);
        }
        aVar2 = pObj_00->field_5;
        (pObj_00->field_5).pData = "?";
        for (nCubesThis = 0; nCubesThis < nVars; nCubesThis = nCubesThis + 1) {
          pFanin_00 = Abc_NtkDupObj(pNtk_local,pObj_00,0);
          Abc_ObjAddFanin(pAVar5,pFanin_00);
          for (nCubes = 0; iVar4 = Abc_ObjFaninNum(pObj_00), nCubes < iVar4; nCubes = nCubes + 1) {
            pAVar7 = Abc_ObjFanin(pObj_00,nCubes);
            Abc_ObjAddFanin((pObj_00->field_6).pCopy,(pAVar7->field_6).pCopy);
          }
          local_a4 = nCubesMax;
          if (iVar3 / nCubesMax <= nCubesThis) {
            local_a4 = iVar3 % nCubesMax;
          }
          iVar4 = Abc_ObjFaninNum(pObj_00);
          pcVar6 = pSopStr2 + (iVar4 + 3) * local_a4;
          cVar1 = *pcVar6;
          *pcVar6 = '\0';
          pcVar8 = Abc_SopRegister((Mem_Flex_t *)pNtk_local->pManFunc,pSopStr2);
          (pFanin_00->field_5).pData = pcVar8;
          *pcVar6 = cVar1;
          pSopStr2 = pcVar6;
        }
        pObj_00->field_5 = aVar2;
        (pObj_00->field_6).pCopy = pAVar5;
      }
      else {
        for (nCubes = 0; iVar3 = Abc_ObjFaninNum(pObj_00), nCubes < iVar3; nCubes = nCubes + 1) {
          pAVar5 = Abc_ObjFanin(pObj_00,nCubes);
          Abc_ObjAddFanin((pObj_00->field_6).pCopy,(pAVar5->field_6).pCopy);
        }
      }
    }
    Vec_PtrFree(p);
    Abc_NtkFinalize(pNtk,pNtk_local);
    iVar3 = Abc_NtkCheck(pNtk_local);
    if (iVar3 == 0) {
      fprintf(_stdout,"Abc_NtkDup(): Network check has failed.\n");
    }
    pNtk->pCopy = pNtk_local;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkSplitSop( Abc_Ntk_t * pNtk, int nCubesMax, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pObjNewRoot;
    int i, k, j, nCubes, nCubesThis, nSplits;
    char * pSopStr, * pSopStr2, * pTempSop, Symb;
    if ( pNtk == NULL )
        return NULL;
    assert( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pObjNewRoot = Abc_NtkDupObj( pNtkNew, pObj, 0 );
        nCubes = Abc_SopGetCubeNum( (char *)pObj->pData );
        if ( nCubes <= nCubesMax )
        {            
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
            continue;
        }
        nSplits = (nCubes / nCubesMax) + (int)(nCubes % nCubesMax > 0);
        pSopStr = (char *)pObjNewRoot->pData;
        pObjNewRoot->pData = Abc_SopCreateOr((Mem_Flex_t *)pNtkNew->pManFunc, nSplits, NULL);
        if ( Abc_SopIsComplement(pSopStr) )
        {
            Abc_SopComplement( pSopStr );
            Abc_SopComplement( (char *)pObjNewRoot->pData );
        }
        pTempSop = (char *)pObj->pData; pObj->pData = (char *)"?";
        for ( j = 0; j < nSplits; j++ )
        {
            // clone the node
            pObjNew = Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObjNewRoot, pObjNew );
            // get its cubes
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
            // create SOP for this node
            nCubesThis = (j < nCubes / nCubesMax) ? nCubesMax : nCubes % nCubesMax;
            pSopStr2 = pSopStr + (Abc_ObjFaninNum(pObj) + 3) * nCubesThis;
            Symb = *pSopStr2; *pSopStr2 = 0;
            pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, pSopStr );
            *pSopStr2 = Symb;
            pSopStr = pSopStr2;
        }
        // update 
        pObj->pData = pTempSop;
        pObj->pCopy = pObjNewRoot;
    }
    Vec_PtrFree( vNodes );
    Abc_NtkFinalize( pNtk, pNtkNew );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}